

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalc.cpp
# Opt level: O2

void __thiscall
summarycalc::dosummary
          (summarycalc *this,int sample_size,int event_id,int item_id,int coverage_or_output_id,
          int sidx,OASIS_FLOAT gul,OASIS_FLOAT expval)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  
  if (this->last_event_id_ != event_id) {
    reset_for_new_event(this,sample_size,event_id);
  }
  if (this->last_item_id_ != item_id) {
    piVar2 = (this->foutIndex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (piVar3 = (this->foutIndex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start; piVar3 != piVar2; piVar3 = piVar3 + 1) {
      iVar1 = (this->co_to_s_[*piVar3]->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start[coverage_or_output_id];
      this->sse[*piVar3][iVar1] = this->sse[*piVar3][iVar1] + expval;
    }
    this->last_item_id_ = item_id;
  }
  processsummarysets(this,coverage_or_output_id,sidx,gul);
  return;
}

Assistant:

void summarycalc::dosummary(int sample_size, int event_id, int item_id,
			    int coverage_or_output_id, int sidx,
			    OASIS_FLOAT gul, OASIS_FLOAT expval)
{
	if (last_event_id_ != event_id)
		reset_for_new_event(sample_size, event_id);

	if (item_id != last_item_id_) {
		for (auto it = foutIndex_.begin(); it != foutIndex_.end(); ++it) {
			coverage_id_or_output_id_to_Summary_id &p = *co_to_s_[*it];
			int summary_id = p[coverage_or_output_id];
			OASIS_FLOAT *se = sse[*it];
			se[summary_id] += expval;
		}
		last_item_id_ = item_id;
	}

	processsummarysets(coverage_or_output_id, sidx, gul);
}